

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O3

bool miniros::network::fillAddress(sockaddr_in *my_addr,NetAddress *address)

{
  ushort uVar1;
  char *pcVar2;
  Type TVar3;
  char *pcVar4;
  void *__dest;
  size_t sVar5;
  size_t __size;
  char ipBuffer [255];
  char acStack_138 [264];
  
  NetAddress::reset(address);
  uVar1 = my_addr->sin_family;
  if (uVar1 == 2) {
    TVar3 = AddressIPv4;
  }
  else {
    if (uVar1 != 10) {
      address->type = AddressInvalid;
      return false;
    }
    TVar3 = AddressIPv6;
  }
  address->type = TVar3;
  address->port = (uint)(ushort)(my_addr->sin_port << 8 | my_addr->sin_port >> 8);
  pcVar4 = inet_ntop((uint)uVar1,&my_addr->sin_addr,acStack_138,0xff);
  if (pcVar4 == (char *)0x0) {
    address->port = 0;
  }
  else {
    pcVar2 = (char *)(address->address)._M_string_length;
    strlen(acStack_138);
    std::__cxx11::string::_M_replace((ulong)&address->address,0,pcVar2,(ulong)acStack_138);
    sVar5 = 0x1c;
    if (address->type != AddressIPv6) {
      sVar5 = 0;
    }
    __size = 0x10;
    if (address->type != AddressIPv4) {
      __size = sVar5;
    }
    __dest = malloc(__size);
    address->rawAddress = __dest;
    memcpy(__dest,my_addr,__size);
  }
  return pcVar4 != (char *)0x0;
}

Assistant:

bool fillAddress(const sockaddr_in& my_addr, NetAddress& address)
{
  address.reset();

  if (my_addr.sin_family == AF_INET) {
    address.type = NetAddress::AddressIPv4;
    address.port = ntohs(my_addr.sin_port);
  } else if (my_addr.sin_family == AF_INET6) {
    address.type = NetAddress::AddressIPv6;
    address.port = ntohs(my_addr.sin_port);
  } else {
    address.type = NetAddress::AddressInvalid;
    return false;
  }

  char ipBuffer[255];
  if (!inet_ntop(my_addr.sin_family, &my_addr.sin_addr, ipBuffer, sizeof(ipBuffer))) {
    address.port = 0;
    return false;
  }
  address.address = ipBuffer;

  size_t size = getAddressSize(address.type);
  sockaddr_in* outAddr = static_cast<sockaddr_in*>(malloc(size));
  address.rawAddress = outAddr;
  memcpy(outAddr, &my_addr, size);
  return true;
}